

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

int __thiscall cppforth::Forth::returnStackRestore(Forth *this)

{
  uint uVar1;
  uint local_14;
  uint locals;
  Forth *this_local;
  
  local_14 = ForthStack<unsigned_int>::getTop(&this->returnStack);
  ForthStack<unsigned_int>::pop(&this->returnStack);
  while (local_14 != 0) {
    ForthStack<unsigned_int>::pop(&this->returnStack);
    local_14 = local_14 - 1;
  }
  uVar1 = ForthStack<unsigned_int>::getTop(&this->returnStack);
  this->next_command = uVar1;
  ForthStack<unsigned_int>::pop(&this->returnStack);
  return 0;
}

Assistant:

int returnStackRestore(){
			auto locals = returnStack.getTop();  returnStack.pop();
			while(locals-- > 0) {
				returnStack.pop();
			}
			next_command = returnStack.getTop(); returnStack.pop();
			return 0;
		}